

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataflow_tests.cpp
# Opt level: O1

void __thiscall
expr_tests::Dataflow_BinaryOperations_Test::~Dataflow_BinaryOperations_Test
          (Dataflow_BinaryOperations_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Dataflow, BinaryOperations) {
  nwcpp::Dataflow dag;

  const auto a = dag.DeclareVariable("a");
  const auto b = dag.DeclareVariable("b");

  const auto sum = dag.CreateBinaryOp('+', a, b);
  const auto product = dag.CreateBinaryOp('*', a, b);
  const auto diff = dag.CreateBinaryOp('-', a, b);
  const auto div = dag.CreateBinaryOp('/', a, b);
  const auto test = dag.CreateBinaryOp('-', sum, diff);

  // variables are not yet initialized
  EXPECT_THROW(sum->Eval(), std::runtime_error);

  a->Assign(1);

  // ... still not initialized
  EXPECT_THROW(sum->Eval(), std::runtime_error);

  b->Assign(5);
  EXPECT_EQ(sum->Eval(), 6);
  EXPECT_EQ(product->Eval(), 5);
  EXPECT_EQ(diff->Eval(), -4);
  EXPECT_EQ(div->Eval(), 0);
  EXPECT_EQ(test->Eval(), 10);

  b->Assign(0);
  EXPECT_EQ(sum->Eval(), 1);
  EXPECT_EQ(product->Eval(), 0);
  EXPECT_EQ(diff->Eval(), 1);
  EXPECT_THROW(div->Eval(), std::runtime_error);  // div by zero
  EXPECT_EQ(test->Eval(), 0);
}